

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_attribute
               (Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,int index,
               int wmask,int flags)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char *fmt;
  undefined4 in_register_00000084;
  char index_str [16];
  char regnum_str [16];
  char acStack_98 [64];
  char local_58 [40];
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  pcVar3 = get_D3D_register_string
                     (ctx,regtype,regnum,local_58 + 0x10,CONCAT44(in_register_00000084,index));
  snprintf(acStack_98,0x40,"%s%s",pcVar3,local_58 + 0x10);
  if (index != 0) {
    snprintf(local_58,0x10,"%u",(ulong)(uint)index);
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if ((flags & 4U) != 0) {
      pcVar3 = ctx->profile->name;
      fmt = "centroid unsupported in %s profile";
      goto LAB_001133dc;
    }
    if ((regtype & ~REG_TYPE_INPUT) != REG_TYPE_COLOROUT) {
      if ((REG_TYPE_MISCTYPE < regtype) ||
         ((0x2000aU >> (regtype & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0)) {
        fmt = "%s";
        pcVar3 = "unknown pixel shader attribute register";
        goto LAB_001133dc;
      }
      push_output(ctx,&ctx->inputs);
      sVar4 = buffer_size(ctx->inputs);
      if (sVar4 == 0) {
        output_line(ctx,"struct %s_Input",ctx->mainfn);
        output_line(ctx,"{");
      }
      ctx->indent = ctx->indent + 1;
      if (regtype == REG_TYPE_MISCTYPE) {
        if (regnum == 0) {
          pcVar3 = "float4 %s [[position]];";
LAB_00113656:
          output_line(ctx,pcVar3,acStack_98);
        }
        else {
          if (regnum == 1) {
            pcVar3 = "bool %s [[front_facing]];";
            goto LAB_00113656;
          }
          failf(ctx,"%s","BUG: unhandled misc register");
        }
        goto LAB_00113663;
      }
      if (usage == MOJOSHADER_USAGE_FOG) {
        pcVar3 = "float4 %s [[user(fog)]];";
        goto LAB_00113656;
      }
      if (usage == MOJOSHADER_USAGE_COLOR) {
        pcVar3 = "float4 %s [[user(color%d)]];";
        uVar5 = (ulong)(uint)index;
        goto LAB_001133af;
      }
      if (usage != MOJOSHADER_USAGE_TEXCOORD) goto LAB_00113663;
      bVar1 = ctx->major_ver;
      uVar2 = (uint)ctx->minor_ver;
      if (ctx->minor_ver == 0xff) {
        uVar2 = 0;
      }
      output_line(ctx,"float4 %s [[user(texcoord%d)]];",acStack_98,(ulong)(uint)index);
      pop_output(ctx);
      if ((uVar2 | (uint)bVar1 << 0x10) < 0x10004) {
        return;
      }
      goto LAB_00113692;
    }
    push_output(ctx,&ctx->outputs);
    sVar4 = buffer_size(ctx->outputs);
    if (sVar4 == 0) {
      output_line(ctx,"struct %s_Output",ctx->mainfn);
      output_line(ctx,"{");
    }
    ctx->indent = ctx->indent + 1;
    if (regtype != REG_TYPE_COLOROUT) {
      pcVar3 = "float %s [[depth(any)]];";
      goto LAB_001135a7;
    }
    pcVar3 = "float4 %s [[color(%d)]];";
    uVar5 = (ulong)(uint)regnum;
    goto LAB_00113597;
  }
  if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
    fmt = "%s";
    pcVar3 = "Unknown shader type";
    goto LAB_001133dc;
  }
  if (2 < ctx->major_ver) {
    if (regtype == REG_TYPE_OUTPUT) goto LAB_00113491;
    if (regtype != REG_TYPE_INPUT) goto switchD_0011328c_caseD_2;
switchD_0011328c_caseD_1:
    push_output(ctx,&ctx->inputs);
    sVar4 = buffer_size(ctx->inputs);
    if (sVar4 == 0) {
      output_line(ctx,"struct %s_Input",ctx->mainfn);
      output_line(ctx,"{");
    }
    ctx->indent = ctx->indent + 1;
    pcVar3 = "float4 %s [[attribute(%d)]];";
    uVar5 = (ulong)(uint)regnum;
LAB_001133af:
    output_line(ctx,pcVar3,acStack_98,uVar5);
LAB_00113663:
    if (ctx->output_stack_len < 1) goto LAB_00113750;
    uVar2 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar2;
    ctx->output = ctx->output_stack[uVar2];
    ctx->indent = ctx->indent_stack[uVar2];
LAB_00113692:
    push_output(ctx,&ctx->mainline_top);
    ctx->indent = ctx->indent + 1;
    pcVar3 = "#define %s input.%s";
    goto LAB_001136ae;
  }
  index = regnum;
  switch(regtype) {
  case REG_TYPE_INPUT:
    goto switchD_0011328c_caseD_1;
  default:
switchD_0011328c_caseD_2:
    fmt = "%s";
    pcVar3 = "unknown vertex shader attribute register";
LAB_001133dc:
    failf(ctx,fmt,pcVar3);
    return;
  case REG_TYPE_RASTOUT:
    if ((uint)regnum < 3) {
      usage = *(MOJOSHADER_usage *)(&DAT_0012c538 + (ulong)(uint)regnum * 4);
    }
    break;
  case REG_TYPE_ATTROUT:
    usage = MOJOSHADER_USAGE_COLOR;
    break;
  case REG_TYPE_OUTPUT:
    usage = MOJOSHADER_USAGE_TEXCOORD;
  }
LAB_00113491:
  push_output(ctx,&ctx->outputs);
  sVar4 = buffer_size(ctx->outputs);
  if (sVar4 == 0) {
    output_line(ctx,"struct %s_Output",ctx->mainfn);
    output_line(ctx,"{");
  }
  ctx->indent = ctx->indent + 1;
  switch(usage) {
  case MOJOSHADER_USAGE_POSITION:
    pcVar3 = "float4 %s [[position]];";
    break;
  default:
    goto switchD_001134fb_caseD_1;
  case MOJOSHADER_USAGE_POINTSIZE:
    pcVar3 = "float4 %s [[point_size]];";
    break;
  case MOJOSHADER_USAGE_TEXCOORD:
    pcVar3 = "float4 %s [[user(texcoord%d)]];";
    goto LAB_0011358e;
  case MOJOSHADER_USAGE_COLOR:
    pcVar3 = "float4 %s [[user(color%d)]];";
LAB_0011358e:
    uVar5 = (ulong)(uint)index;
LAB_00113597:
    output_line(ctx,pcVar3,acStack_98,uVar5);
    goto switchD_001134fb_caseD_1;
  case MOJOSHADER_USAGE_FOG:
    pcVar3 = "float4 %s [[user(fog)]];";
  }
LAB_001135a7:
  output_line(ctx,pcVar3,acStack_98);
switchD_001134fb_caseD_1:
  if (0 < ctx->output_stack_len) {
    uVar2 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar2;
    ctx->output = ctx->output_stack[uVar2];
    ctx->indent = ctx->indent_stack[uVar2];
    push_output(ctx,&ctx->mainline_top);
    ctx->indent = ctx->indent + 1;
    pcVar3 = "#define %s output.%s";
LAB_001136ae:
    output_line(ctx,pcVar3,acStack_98);
    if (0 < ctx->output_stack_len) {
      uVar2 = ctx->output_stack_len - 1;
      ctx->output_stack_len = uVar2;
      ctx->output = ctx->output_stack[uVar2];
      ctx->indent = ctx->indent_stack[uVar2];
      push_output(ctx,&ctx->mainline);
      ctx->indent = ctx->indent + 1;
      output_line(ctx,"#undef %s",acStack_98);
      if (0 < ctx->output_stack_len) {
        uVar2 = ctx->output_stack_len - 1;
        ctx->output_stack_len = uVar2;
        ctx->output = ctx->output_stack[uVar2];
        ctx->indent = ctx->indent_stack[uVar2];
        return;
      }
    }
  }
LAB_00113750:
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    char index_str[16] = { '\0' };
    char var[64];

    get_METAL_varname_in_buf(ctx, regtype, regnum, var, sizeof (var));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        if (regtype == REG_TYPE_INPUT)
        {
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;
            output_line(ctx, "float4 %s [[attribute(%d)]];", var, regnum);
            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: might trigger unused var warnings in Clang.
            //output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            output_line(ctx, "#define %s input.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;

            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    output_line(ctx, "float4 %s [[position]];", var);
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    output_line(ctx, "float4 %s [[point_size]];", var);
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);
                    break;
                case MOJOSHADER_USAGE_FOG:
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float4 &%s = output.%s;", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        // samplers DCLs get handled in emit_METAL_sampler().

        if (flags & MOD_CENTROID)  // !!! FIXME
        {
            failf(ctx, "centroid unsupported in %s profile", ctx->profile->name);
            return;
        } // if

        if ((regtype == REG_TYPE_COLOROUT) || (regtype == REG_TYPE_DEPTHOUT))
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_COLOROUT)
                output_line(ctx, "float4 %s [[color(%d)]];", var, regnum);
            else if (regtype == REG_TYPE_DEPTHOUT)
                output_line(ctx, "float %s [[depth(any)]];", var);

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float%s &%s = output.%s;", (regtype == REG_TYPE_DEPTHOUT) ? "" : "4", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) ||
                 (regtype == REG_TYPE_INPUT) ||
                 (regtype == REG_TYPE_MISCTYPE))
        {
            int skipreference = 0;
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_MISCTYPE)
            {
                const MiscTypeType mt = (MiscTypeType) regnum;
                if (mt == MISCTYPE_TYPE_FACE)
                    output_line(ctx, "bool %s [[front_facing]];", var);
                else if (mt == MISCTYPE_TYPE_POSITION)
                    output_line(ctx, "float4 %s [[position]];", var);
                else
                    fail(ctx, "BUG: unhandled misc register");
            } // else if

            else
            {
                if (usage == MOJOSHADER_USAGE_TEXCOORD)
                {
                    // ps_1_1 does a different hack for this attribute.
                    //  Refer to emit_METAL_global()'s REG_TYPE_ADDRESS code.
                    if (!shader_version_atleast(ctx, 1, 4))
                        skipreference = 1;
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                } // if

                else if (usage == MOJOSHADER_USAGE_COLOR)
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);

                else if (usage == MOJOSHADER_USAGE_FOG)
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
            } // else

            pop_output(ctx);

            // !!! FIXME: can cause unused var warnings in Clang...
            #if 0
            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            if ((regtype == REG_TYPE_MISCTYPE)&&(regnum == MISCTYPE_TYPE_FACE))
                output_line(ctx, "constant bool &%s = input.%s;", var, var);
            else if (!skipreference)
                output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            pop_output(ctx);
            #endif

            if (!skipreference)
            {
                push_output(ctx, &ctx->mainline_top);
                ctx->indent++;
                output_line(ctx, "#define %s input.%s", var, var);
                pop_output(ctx);
                push_output(ctx, &ctx->mainline);
                ctx->indent++;
                output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
                pop_output(ctx);
            } // if
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}